

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

reference __thiscall
slang::SmallVectorBase<slang::parsing::Trivia>::emplace_back<slang::parsing::Trivia>
          (SmallVectorBase<slang::parsing::Trivia> *this,Trivia *args)

{
  iterator pTVar1;
  undefined8 *in_RSI;
  SmallVectorBase<slang::parsing::Trivia> *in_RDI;
  Trivia *in_stack_00000020;
  pointer in_stack_00000028;
  SmallVectorBase<slang::parsing::Trivia> *in_stack_00000030;
  pointer local_8;
  
  if (in_RDI->len == in_RDI->cap) {
    end(in_RDI);
    local_8 = emplaceRealloc<slang::parsing::Trivia>
                        (in_stack_00000030,in_stack_00000028,in_stack_00000020);
  }
  else {
    pTVar1 = end(in_RDI);
    (pTVar1->field_0).rawText.ptr = (char *)*in_RSI;
    *(undefined8 *)((long)&pTVar1->field_0 + 8) = in_RSI[1];
    in_RDI->len = in_RDI->len + 1;
    local_8 = back(in_RDI);
  }
  return local_8;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }